

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

RegOpnd * __thiscall IRBuilderAsmJs::BuildIntConstOpnd(IRBuilderAsmJs *this,RegSlot regSlot)

{
  code *pcVar1;
  Type TVar2;
  bool bVar3;
  RegSlot RVar4;
  uint32 uVar5;
  JITTimeFunctionBody *pJVar6;
  void *pvVar7;
  AsmJsJITInfo *this_00;
  undefined4 *puVar8;
  IntConstOpnd *pIVar9;
  TypedSlotInfo local_44;
  
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  pvVar7 = JITTimeFunctionBody::GetConstTable(pJVar6);
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar6);
  AsmJsJITInfo::GetTypedSlotInfo(&local_44,this_00,INT32);
  if (local_44.constSrcByteOffset == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x15e,"(info.constSrcByteOffset != Js::Constants::InvalidOffset)",
                       "info.constSrcByteOffset != Js::Constants::InvalidOffset");
    if (!bVar3) goto LAB_004fbdea;
    *puVar8 = 0;
  }
  TVar2 = local_44.constSrcByteOffset;
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  RVar4 = JITTimeFunctionBody::GetConstCount(pJVar6);
  if (0x1fffffff < RVar4) {
    Math::DefaultOverflowPolicy();
  }
  if (RVar4 << 3 <= TVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x15f,
                       "(info.constSrcByteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount()))"
                       ,
                       "info.constSrcByteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount())"
                      );
    if (!bVar3) goto LAB_004fbdea;
    *puVar8 = 0;
  }
  uVar5 = GetTypedRegFromRegSlot(this,regSlot,INT32);
  if ((uVar5 == 0) || (local_44.constCount <= uVar5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x162,
                       "(srcReg >= Js::FunctionBody::FirstRegSlot && srcReg < info.constCount)",
                       "srcReg >= Js::FunctionBody::FirstRegSlot && srcReg < info.constCount");
    if (!bVar3) {
LAB_004fbdea:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar8 = 0;
  }
  pIVar9 = IR::IntConstOpnd::New
                     ((long)*(int *)((long)pvVar7 +
                                    (ulong)uVar5 * 4 + (ulong)local_44.constSrcByteOffset),TyInt32,
                      this->m_func,false);
  return (RegOpnd *)pIVar9;
}

Assistant:

IR::RegOpnd *
IRBuilderAsmJs::BuildIntConstOpnd(Js::RegSlot regSlot)
{
    Js::Var * constTable = (Js::Var*)m_func->GetJITFunctionBody()->GetConstTable();
    const WAsmJs::TypedSlotInfo& info = m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetTypedSlotInfo(WAsmJs::INT32);
    Assert(info.constSrcByteOffset != Js::Constants::InvalidOffset);
    AssertOrFailFast(info.constSrcByteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount()));
    int* intConstTable = reinterpret_cast<int*>(((byte*)constTable) + info.constSrcByteOffset);
    uint32 srcReg = GetTypedRegFromRegSlot(regSlot, WAsmJs::INT32);
    AssertOrFailFast(srcReg >= Js::FunctionBody::FirstRegSlot && srcReg < info.constCount);
    const int32 value = intConstTable[srcReg];
    IR::IntConstOpnd *opnd = IR::IntConstOpnd::New(value, TyInt32, m_func);

    return (IR::RegOpnd*)opnd;
}